

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db.cpp
# Opt level: O2

void wallet::ReadDatabaseArgs(ArgsManager *args,DatabaseOptions *options)

{
  bool bVar1;
  int64_t iVar2;
  long in_FS_OFFSET;
  allocator<char> local_39;
  string local_38;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,"-unsafesqlitesync",&local_39);
  bVar1 = ArgsManager::GetBoolArg(args,&local_38,options->use_unsafe_sync);
  options->use_unsafe_sync = bVar1;
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"-privdb",&local_39);
  bVar1 = ArgsManager::GetBoolArg(args,&local_38,(bool)(options->use_shared_memory ^ 1));
  options->use_shared_memory = !bVar1;
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"-dblogsize",&local_39);
  iVar2 = ArgsManager::GetIntArg(args,&local_38,options->max_log_mb);
  options->max_log_mb = iVar2;
  std::__cxx11::string::~string((string *)&local_38);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void ReadDatabaseArgs(const ArgsManager& args, DatabaseOptions& options)
{
    // Override current options with args values, if any were specified
    options.use_unsafe_sync = args.GetBoolArg("-unsafesqlitesync", options.use_unsafe_sync);
    options.use_shared_memory = !args.GetBoolArg("-privdb", !options.use_shared_memory);
    options.max_log_mb = args.GetIntArg("-dblogsize", options.max_log_mb);
}